

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

void Abc_NtkRemovePo(Abc_Ntk_t *pNtk,int iOutput,int fRemoveConst0)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pObj;
  int fRemoveConst0_local;
  int iOutput_local;
  Abc_Ntk_t *pNtk_local;
  
  pObj_00 = Abc_NtkPo(pNtk,iOutput);
  pAVar2 = Abc_ObjFanin0(pObj_00);
  pAVar3 = Abc_AigConst1(pNtk);
  if (pAVar2 == pAVar3) {
    iVar1 = Abc_ObjFaninC0(pObj_00);
    if (iVar1 == fRemoveConst0) {
      Abc_NtkDeleteObj(pObj_00);
    }
  }
  return;
}

Assistant:

void Abc_NtkRemovePo( Abc_Ntk_t * pNtk, int iOutput, int fRemoveConst0 )
{
    Abc_Obj_t * pObj = Abc_NtkPo(pNtk, iOutput);
    if ( Abc_ObjFanin0(pObj) == Abc_AigConst1(pNtk) && Abc_ObjFaninC0(pObj) == fRemoveConst0 )
        Abc_NtkDeleteObj( pObj );
}